

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O3

Gia_Man_t * Gia_ManCleanupOutputs(Gia_Man_t *p,int nOutputs)

{
  undefined1 *puVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  long lVar4;
  Vec_Int_t *pVVar5;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaScl.c"
                  ,0x69,"Gia_Man_t *Gia_ManCleanupOutputs(Gia_Man_t *, int)");
  }
  if (p->vCos->nSize <= nOutputs) {
    __assert_fail("nOutputs < Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaScl.c"
                  ,0x6a,"Gia_Man_t *Gia_ManCleanupOutputs(Gia_Man_t *, int)");
  }
  Gia_ManCombMarkUsed(p);
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      iVar2 = pVVar5->pArray[lVar4];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if ((nOutputs <= lVar4) || (p->pObjs == (Gia_Obj_t *)0x0)) break;
      puVar1 = &p->pObjs[iVar2].field_0x3;
      *puVar1 = *puVar1 | 0x40;
      lVar4 = lVar4 + 1;
      pVVar5 = p->vCos;
    } while (lVar4 < pVVar5->nSize);
  }
  pGVar3 = Gia_ManDupMarked(p);
  return pGVar3;
}

Assistant:

Gia_Man_t * Gia_ManCleanupOutputs( Gia_Man_t * p, int nOutputs )
{
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManRegNum(p) == 0 );
    assert( nOutputs < Gia_ManCoNum(p) );
    Gia_ManCombMarkUsed( p );
    Gia_ManForEachCo( p, pObj, i )
        if ( i < nOutputs )
            pObj->fMark0 = 1;
        else
            break;
    return Gia_ManDupMarked( p );
}